

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

bool __thiscall senjo::UCIAdapter::Start(UCIAdapter *this,ChessEngine *chessEngine)

{
  ChessEngine *pCVar1;
  Output local_10;
  
  pCVar1 = this->engine;
  if (pCVar1 == (ChessEngine *)0x0) {
    this->engine = chessEngine;
  }
  else {
    Output::Output(&local_10,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"UCIAdapter already started",0x1a);
    Output::~Output(&local_10);
  }
  return pCVar1 == (ChessEngine *)0x0;
}

Assistant:

bool UCIAdapter::Start(ChessEngine& chessEngine)
{
  if (engine) {
    Output() << "UCIAdapter already started";
    return false;
  }

  engine = &chessEngine;
  return true;
}